

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementTetraCorot_10::LoadableGetStateBlock_w(ChElementTetraCorot_10 *this)

{
  ChStateDelta *in_RDX;
  int in_ESI;
  
  LoadableGetStateBlock_w
            ((ChElementTetraCorot_10 *)
             ((this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[-7] + -0x48 +
             (long)(&(this->super_ChElementCorotational).A + -1) + 0x40),in_ESI,in_RDX);
  return;
}

Assistant:

void ChElementTetraCorot_10::LoadableGetStateBlock_w(int block_offset, ChStateDelta& mD) {
    mD.segment(block_offset + 0, 3) = this->nodes[0]->GetPos_dt().eigen();
    mD.segment(block_offset + 3, 3) = this->nodes[1]->GetPos_dt().eigen();
    mD.segment(block_offset + 6, 3) = this->nodes[2]->GetPos_dt().eigen();
    mD.segment(block_offset + 9, 3) = this->nodes[3]->GetPos_dt().eigen();
    mD.segment(block_offset + 12, 3) = this->nodes[4]->GetPos_dt().eigen();
    mD.segment(block_offset + 15, 3) = this->nodes[5]->GetPos_dt().eigen();
    mD.segment(block_offset + 18, 3) = this->nodes[6]->GetPos_dt().eigen();
    mD.segment(block_offset + 21, 3) = this->nodes[7]->GetPos_dt().eigen();
    mD.segment(block_offset + 24, 3) = this->nodes[8]->GetPos_dt().eigen();
    mD.segment(block_offset + 27, 3) = this->nodes[9]->GetPos_dt().eigen();
}